

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementBeamANCF_3333.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElementBeamANCF_3333::ComputeInternalForcesContIntPreInt
          (ChElementBeamANCF_3333 *this,ChVectorDynamic<> *Fi)

{
  Matrix<double,__1,__1,_0,__1,__1> *this_00;
  double dVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined8 uVar5;
  Index index;
  double *pdVar6;
  void *pvVar7;
  ulong uVar8;
  undefined8 *puVar9;
  Index outer;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_3,_0,_9,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>_>
  **alpha;
  double *pdVar10;
  char *__function;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_3,_0,_9,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>_>
  *pCVar11;
  long lVar12;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_3,_0,_9,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>_>
  *a_lhs;
  long lVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  Map<Eigen::Matrix<double,_81,_1,_0,_81,_1>,_0,_Eigen::Stride<0,_0>_> K1_vec;
  MatrixNx3 QiCompactLiu;
  Matrix3xN ebar;
  MatrixNxN K1_matrix;
  MatrixNxN PI1_matrix;
  Matrix3xN ebardot;
  Map<Eigen::Matrix<double,_81,_1,_0,_81,_1>,_0,_Eigen::Stride<0,_0>_> local_7f0;
  Matrix<double,__1,__1,_0,__1,__1> *local_7e0;
  Transpose<Eigen::Matrix<double,_3,_9,_1,_3,_9>_> local_7d8;
  Scalar local_7d0;
  undefined1 local_7c8 [128];
  undefined1 local_748 [24];
  undefined1 auStack_730 [40];
  undefined1 auStack_708 [24];
  Matrix3xN local_6f0;
  Matrix<double,_9,_9,_0,_9,_9> local_618;
  Matrix<double,_9,_9,_1,_9,_9> local_390;
  Matrix3xN local_108;
  
  CalcCoordMatrix(this,&local_6f0);
  CalcCoordDerivMatrix(this,&local_108);
  a_lhs = (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_3,_0,_9,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>_>
           *)&local_618;
  local_618.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[2] =
       0.5;
  local_618.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[3] =
       (double)&local_6f0;
  local_618.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_0,_9,_9>_>.m_storage.m_data.array[5] =
       (double)&local_6f0;
  memset(&local_390,0,0x288);
  local_7c8._0_8_ = 0x3ff0000000000000;
  Eigen::internal::
  generic_product_impl<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,9,3,0,9,3>const>const,Eigen::Transpose<Eigen::Matrix<double,3,9,1,3,9>>const>,Eigen::Matrix<double,3,9,1,3,9>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::scaleAndAddTo<Eigen::Matrix<double,9,9,1,9,9>>(&local_390,a_lhs,&local_6f0,(Scalar *)local_7c8);
  auVar15 = local_7c8._0_64_;
  if (this->m_damping_enabled == true) {
    lVar13 = 0;
    local_7c8._16_8_ = this->m_Alpha;
    local_7c8._32_32_ = auVar15._32_32_;
    local_7c8._24_8_ = &local_108;
    auVar16 = local_7c8._0_64_;
    local_7c8._48_16_ = auVar15._48_16_;
    local_7c8._0_40_ = auVar16._0_40_;
    local_7c8._40_8_ = &local_6f0;
    memset(&local_618,0,0x288);
    alpha = (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_3,_0,_9,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>_>
             **)&local_7f0;
    local_7f0._0_8_ =
         (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_3,_0,_9,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>_>
          *)0x3ff0000000000000;
    Eigen::internal::
    generic_product_impl<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,9,3,0,9,3>const>const,Eigen::Transpose<Eigen::Matrix<double,3,9,1,3,9>>const>,Eigen::Matrix<double,3,9,1,3,9>,Eigen::DenseShape,Eigen::DenseShape,8>
    ::scaleAndAddTo<Eigen::Matrix<double,9,9,0,9,9>>
              (&local_618,
               (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_3,_0,_9,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>_>
                *)local_7c8,&local_6f0,(Scalar *)alpha);
    auVar14 = vpbroadcastq_avx512vl();
    auVar4 = vpaddq_avx2(auVar14,_DAT_009a7b40);
    auVar15 = vpmovsxbq_avx512f(ZEXT816(0x302010008));
    auVar3 = vpaddq_avx(auVar14._0_16_,_DAT_009a7bc0);
    puVar9 = (undefined8 *)CONCAT71((int7)((ulong)alpha >> 8),0x80);
    auVar15 = vpermi2q_avx512f(auVar15,ZEXT3264(auVar4),ZEXT3264(auVar14));
    auVar16 = vpmovsxbq_avx512f(ZEXT816(0x9080403020100));
    auVar15 = vpermi2q_avx512f(auVar16,auVar15,ZEXT1664(auVar3));
    auVar16 = vpbroadcastq_avx512f();
    bVar2 = (bool)((byte)(((ulong)puVar9 & 0xffffffff) >> 7) & 1);
    auVar15._56_8_ = (ulong)bVar2 * auVar16._56_8_ | (ulong)!bVar2 * auVar15._56_8_;
    pdVar10 = local_390.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.
              m_data.array + 8;
    do {
      auVar16 = vpbroadcastq_avx512f();
      auVar16 = vpsllq_avx512f(auVar16,3);
      vpaddq_avx512f(auVar15,auVar16);
      auVar16 = vgatherqpd_avx512f(*puVar9);
      auVar16 = vaddpd_avx512f(auVar16,*(undefined1 (*) [64])
                                        ((plain_array<double,_81,_1,_0> *)(pdVar10 + -8))->array);
      *(undefined1 (*) [64])((plain_array<double,_81,_1,_0> *)(pdVar10 + -8))->array = auVar16;
      uVar5 = lVar13 + 0xfffffffffffffff7;
      lVar13 = lVar13 + 1;
      *pdVar10 = local_390.super_PlainObjectBase<Eigen::Matrix<double,_9,_9,_1,_9,_9>_>.m_storage.
                 m_data.array[uVar5] + *pdVar10;
      pdVar10 = pdVar10 + 9;
    } while (lVar13 != 9);
  }
  local_7c8._8_8_ = &local_390;
  local_7c8._0_8_ = &this->m_O1;
  local_7f0._0_8_ = a_lhs;
  if ((this->m_O1).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols
      == 0x51) {
    Eigen::internal::
    Assignment<Eigen::Map<Eigen::Matrix<double,_81,_1,_0,_81,_1>,_0,_Eigen::Stride<0,_0>_>,_Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Map<Eigen::Matrix<double,_81,_1,_0,_81,_1>,_0,_Eigen::Stride<0,_0>_>,_0>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
    ::run(&local_7f0,(SrcXprType *)local_7c8,(assign_op<double,_double> *)&local_7e0);
    if (((this->m_K3Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
         m_storage.m_rows != 9) ||
       ((this->m_K3Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
        m_storage.m_cols != 9)) {
      __assert_fail("aLhs.rows() == aRhs.rows() && aLhs.cols() == aRhs.cols()",
                    "/usr/include/eigen3/Eigen/src/Core/CwiseBinaryOp.h",0x74,
                    "Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, 9, 9, 1>, const Eigen::Matrix<double, -1, -1>>::CwiseBinaryOp(const Lhs &, const Rhs &, const BinaryOp &) [BinaryOp = Eigen::internal::scalar_difference_op<double>, Lhs = const Eigen::Matrix<double, 9, 9, 1>, Rhs = const Eigen::Matrix<double, -1, -1>]"
                   );
    }
    pdVar10 = (this->m_K3Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
              m_storage.m_data;
    this_00 = &this->m_K13Compact;
    if ((((this->m_K13Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
          m_storage.m_rows != 9) ||
        ((this->m_K13Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
         m_storage.m_cols != 9)) &&
       ((Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
                   ((DenseStorage<double,__1,__1,__1,_0> *)this_00,0x51,9,9),
        (this->m_K13Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
        m_storage.m_rows != 9 ||
        ((this->m_K13Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
         m_storage.m_cols != 9)))) {
      __assert_fail("dst.rows() == dstRows && dst.cols() == dstCols",
                    "/usr/include/eigen3/Eigen/src/Core/AssignEvaluator.h",0x2fd,
                    "void Eigen::internal::resize_if_allowed(DstXprType &, const SrcXprType &, const internal::assign_op<T1, T2> &) [DstXprType = Eigen::Matrix<double, -1, -1>, SrcXprType = Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double>, const Eigen::Matrix<double, 9, 9, 1>, const Eigen::Matrix<double, -1, -1>>, T1 = double, T2 = double]"
                   );
    }
    pdVar6 = (this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_data;
    lVar13 = 0;
    do {
      lVar12 = 0;
      pCVar11 = a_lhs;
      do {
        dVar1 = *(double *)pCVar11;
        pCVar11 = (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_3,_0,_9,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>_>
                   *)&pCVar11[1].field_0x20;
        pdVar6[lVar12] = dVar1 - pdVar10[lVar12];
        lVar12 = lVar12 + 1;
      } while (lVar12 != 9);
      lVar13 = lVar13 + 1;
      pdVar10 = pdVar10 + 9;
      a_lhs = (CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_9,_3,_0,_9,_3>_>,_const_Eigen::Transpose<Eigen::Matrix<double,_3,_9,_1,_3,_9>_>_>
               *)&a_lhs->m_lhs;
      pdVar6 = pdVar6 + 9;
    } while (lVar13 != 9);
    if ((this->m_K13Compact).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
        m_storage.m_cols == 9) {
      local_7d8.m_matrix = &local_6f0;
      auVar16 = ZEXT1664((undefined1  [16])0x0);
      auVar15 = vmovdqu64_avx512f(auVar16);
      local_748 = auVar15._0_24_;
      local_7d0 = 1.0;
      local_7c8._0_64_ = vmovdqu64_avx512f(auVar16);
      local_7c8._64_64_ = vmovdqu64_avx512f(auVar16);
      auVar15 = vmovdqu64_avx512f(auVar16);
      auStack_730 = auVar15._0_40_;
      auStack_708 = auVar15._40_24_;
      local_7e0 = this_00;
      Eigen::internal::
      generic_product_impl<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Transpose<Eigen::Matrix<double,3,9,1,3,9>>,Eigen::DenseShape,Eigen::DenseShape,8>
      ::scaleAndAddTo<Eigen::Matrix<double,9,3,1,9,3>>
                ((Matrix<double,_9,_3,_1,_9,_3> *)local_7c8,this_00,&local_7d8,&local_7d0);
      pdVar10 = (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_data;
      if ((Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows !=
          0x1b) {
        if (pdVar10 != (double *)0x0) {
          free((void *)pdVar10[-1]);
        }
        pvVar7 = malloc(0x118);
        if (pvVar7 == (void *)0x0) {
          puVar9 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar9 = std::ostream::_M_insert<bool>;
          __cxa_throw(puVar9,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
        *(void **)(((ulong)pvVar7 & 0xffffffffffffffc0) + 0x38) = pvVar7;
        pdVar10 = (double *)(((ulong)pvVar7 & 0xffffffffffffffc0) + 0x40);
        (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data =
             pdVar10;
        (Fi->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows = 0x1b
        ;
      }
      uVar8 = 0xfffffffffffffff8;
      do {
        auVar15 = vmovdqu64_avx512f(*(undefined1 (*) [64])(local_7c8 + uVar8 * 8 + 0x40));
        auVar15 = vmovdqa64_avx512f(auVar15);
        *(undefined1 (*) [64])(pdVar10 + uVar8 + 8) = auVar15;
        uVar8 = uVar8 + 8;
      } while (uVar8 < 0x10);
      lVar13 = 0x18;
      do {
        pdVar10[lVar13] = *(double *)(local_7c8 + lVar13 * 8);
        lVar13 = lVar13 + 1;
      } while (lVar13 != 0x1b);
      return;
    }
    __function = 
    "Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Transpose<Eigen::Matrix<double, 3, 9, 1>>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Transpose<Eigen::Matrix<double, 3, 9, 1>>, Option = 0]"
    ;
  }
  else {
    __function = 
    "Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Map<Eigen::Matrix<double, 81, 1>>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Map<Eigen::Matrix<double, 81, 1>>, Option = 0]"
    ;
  }
  __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,__function);
}

Assistant:

void ChElementBeamANCF_3333::ComputeInternalForcesContIntPreInt(ChVectorDynamic<>& Fi) {
    // Calculate the generalize internal force vector using the "Pre-Integration" style of method assuming a
    // linear viscoelastic material model (single term damping model).  For this style of method, the components of the
    // generalized internal force vector and its Jacobian that need to be integrated across the volume are calculated
    // once prior to the start of the simulation.

    Matrix3xN ebar;
    Matrix3xN ebardot;

    CalcCoordMatrix(ebar);
    CalcCoordDerivMatrix(ebardot);

    // Calculate PI1 which is a combined form of the nodal coordinates.  It is calculated in matrix form and then later
    // reshaped into vector format (through a simple reinterpretation of the data)
    MatrixNxN PI1_matrix = 0.5 * ebar.transpose() * ebar;

    // If damping is enabled adjust PI1 to account for the extra terms.  This is the only modification required to
    // include damping in the generalized internal force calculation
    if (m_damping_enabled) {
        PI1_matrix += m_Alpha * ebardot.transpose() * ebar;
    }

    MatrixNxN K1_matrix;

    // Setup the reshaped/reinterpreted/mapped forms of PI1 and K1 to make the calculation of K1 simpler
    Eigen::Map<ChVectorN<double, NSF * NSF>> PI1(PI1_matrix.data(), PI1_matrix.size());
    Eigen::Map<ChVectorN<double, NSF * NSF>> K1_vec(K1_matrix.data(), K1_matrix.size());

    // Calculate the matrix K1 in mapped vector form and the resulting matrix will be in the correct form to combine
    // with K3
    K1_vec.noalias() = m_O1 * PI1;

    // Store the combined sum of K1 and K3 since it will be used again in the Jacobian calculation
    m_K13Compact.noalias() = K1_matrix - m_K3Compact;

    // Multiply the combined K1 and K3 matrix by the nodal coordinates in compact form and then remap it into the
    // required vector order that is the generalized internal force vector
    MatrixNx3 QiCompactLiu = m_K13Compact * ebar.transpose();
    Eigen::Map<Vector3N> QiReshapedLiu(QiCompactLiu.data(), QiCompactLiu.size());

    Fi = QiReshapedLiu;
}